

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O0

void mserialize::
     StructDeserializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
     ::deserialize<binlog::Range>(EventSource *t,Range *istream)

{
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  
  uVar1 = 1;
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((EventSource *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             CONCAT44(1,in_stack_ffffffffffffffc8),(Range *)0x25f0d9);
  uVar2 = 0;
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<binlog::Severity,binlog::Range>
            ((EventSource *)((ulong)in_stack_ffffffffffffffd4 << 0x20),
             CONCAT44(uVar1,in_stack_ffffffffffffffc8),(Range *)0x25f0f5);
  uVar3 = 0;
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((EventSource *)(ulong)uVar2,CONCAT44(uVar1,in_stack_ffffffffffffffc8),(Range *)0x25f111
            );
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (Range *)0x25f12d);
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (Range *)0x25f149);
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (Range *)0x25f165);
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (Range *)0x25f181);
  StructDeserializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (Range *)0x25f19d);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }